

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_(const_chaiscript::exception::eval_error_&),_std::function<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_(const_chaiscript::exception::eval_error_&)>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_(const_chaiscript::exception::eval_error_&),_std::function<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_(const_chaiscript::exception::eval_error_&)>_>
           *this)

{
  Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_(const_chaiscript::exception::eval_error_&),_std::function<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_(const_chaiscript::exception::eval_error_&)>_>
  *in_RDI;
  
  ~Proxy_Function_Callable_Impl(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}